

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O3

void ur_pp(double *y,int N,char *alternative,char *type,int lshort,int *klag,double *statistic,
          double *pval)

{
  double *__src;
  size_t __size;
  double dVar1;
  double *pdVar2;
  reg_object __n;
  int iVar3;
  int iVar4;
  int iVar5;
  double *y_00;
  void *__src_00;
  double *x;
  ulong uVar6;
  double *varcovar;
  size_t __size_00;
  char *__s;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_428;
  double dftable_at [48];
  double dftable [48];
  double prob [8];
  double local_78;
  double *local_70;
  reg_object local_68;
  double local_60;
  double *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_40 = (double)CONCAT44(local_40._4_4_,lshort);
  prob[7] = 25.0;
  prob[5] = 0.975;
  prob[6] = 0.99;
  prob[3] = 0.9;
  prob[4] = 0.95;
  prob[1] = 0.05;
  prob[2] = 0.1;
  dftable[0x2f] = 0.01;
  prob[0] = 0.025;
  pdVar9 = &local_428;
  memcpy(pdVar9,&DAT_00156250,0x180);
  memcpy(dftable_at + 0x2f,&DAT_001563d0,0x180);
  local_50 = (double)CONCAT44(local_50._4_4_,N);
  local_38 = (double)((long)N + -1);
  local_48 = (double)(ulong)(N - 1);
  __size_00 = (long)local_38 * 0x10;
  y_00 = (double *)malloc(__size_00);
  __size = (long)N * 8 - 8;
  __src_00 = malloc(__size);
  x = (double *)malloc(__size_00);
  local_68 = (reg_object)__size;
  local_70 = (double *)malloc(__size);
  local_58 = (double *)malloc(0x40);
  uVar8 = (ulong)local_48 & 0xffffffff;
  iVar5 = SUB84(local_48,0);
  if (1 < N) {
    local_60 = (double)(uVar8 * 8);
    uVar10 = (ulong)local_50 & 0xffffffff;
    memcpy(y_00,y + 1,(size_t)local_60);
    memcpy(y_00 + (uVar10 - 1),y,(size_t)local_60);
    uVar6 = 1;
    do {
      *(double *)((long)__src_00 + uVar6 * 8 + -8) = (double)(int)uVar6 - (double)iVar5 * 0.5;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  __src = y_00 + (long)local_38;
  varcovar = (double *)malloc(0x48);
  __n = local_68;
  memcpy(x,__src_00,(size_t)local_68);
  memcpy(x + (long)local_38,__src,(size_t)__n);
  local_68 = reg_init(iVar5,3);
  pdVar2 = local_70;
  regress(local_68,x,y_00,local_70,varcovar,0.95);
  local_78 = 0.0;
  if (1 < local_50._0_4_) {
    uVar6 = 0;
    do {
      local_78 = local_78 + pdVar2[uVar6] * pdVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  dVar13 = (double)iVar5;
  local_78 = local_78 / dVar13;
  bVar11 = local_40._0_4_ == 1;
  local_60 = local_78;
  local_40 = dVar13;
  dVar13 = pow(dVar13 / 100.0,0.25);
  pdVar2 = local_58;
  iVar5 = (int)(dVar13 * *(double *)(&DAT_00155d68 + (ulong)bVar11 * 8));
  if ((klag != (int *)0x0) && (0 < *klag)) {
    iVar5 = *klag;
  }
  local_48 = (double)(ulong)(uint)(SUB84(local_48,0) * SUB84(local_48,0));
  local_58 = (double *)CONCAT44(local_58._4_4_,iVar5);
  ppsum(local_70,SUB84(local_38,0),iVar5,&local_78);
  dVar13 = 0.0;
  dVar14 = 0.0;
  dVar12 = 0.0;
  if (1 < local_50._0_4_) {
    uVar6 = 0;
    dVar13 = 0.0;
    do {
      dVar1 = __src[uVar6];
      dVar13 = dVar13 + dVar1;
      uVar6 = uVar6 + 1;
      dVar14 = dVar14 + dVar1 * dVar1;
      dVar12 = dVar12 + (double)(int)uVar6 * dVar1;
    } while (uVar8 != uVar6);
  }
  iVar5 = SUB84(local_48,0);
  iVar3 = SUB84(local_38,0);
  local_38 = ((double)((iVar3 * 2 + 1) * local_50._0_4_ * iVar3) * dVar13 * dVar13) / -6.0 +
             (double)(local_50._0_4_ * iVar3) * dVar12 * dVar13 +
             (((double)((iVar5 + -1) * iVar5) * dVar14) / 12.0 - dVar12 * local_40 * dVar12);
  iVar4 = strcmp(type,"Z(alpha)");
  if (iVar4 == 0) {
    dVar13 = (double)(iVar5 * iVar3);
    dVar13 = (local_68[1].sigma_upper + -1.0) * local_40 +
             (dVar13 / (local_38 * -24.0)) * (local_78 - local_60) * dVar13;
    pdVar9 = dftable_at + 0x2f;
  }
  else {
    iVar4 = strcmp(type,"Z(t_alpha)");
    if (iVar4 != 0) {
      __s = " Type only admits two values : Z(alpha) and Z(t_alpha) ";
      goto LAB_00149e48;
    }
    local_50 = (local_68[1].sigma_upper + -1.0) / local_68[1].R2[0];
    if (local_60 < 0.0) {
      local_48 = sqrt(local_60);
    }
    else {
      local_48 = SQRT(local_60);
    }
    if (local_78 < 0.0) {
      dVar13 = sqrt(local_78);
    }
    else {
      dVar13 = SQRT(local_78);
    }
    dVar12 = local_38;
    if (local_38 < 0.0) {
      local_38 = dVar13;
      dVar12 = sqrt(dVar12);
      dVar13 = local_38;
    }
    else {
      dVar12 = SQRT(local_38);
    }
    if (local_78 < 0.0) {
      local_48 = local_48 / dVar13;
      local_38 = dVar12 * 6.928203230275509;
      dVar14 = sqrt(local_78);
      dVar13 = local_48;
      dVar12 = local_38;
    }
    else {
      dVar14 = SQRT(local_78);
      dVar13 = local_48 / dVar13;
      dVar12 = dVar12 * 6.928203230275509;
    }
    dVar13 = dVar13 * local_50 -
             (local_78 - local_60) * ((double)(iVar5 * iVar3) / (dVar12 * dVar14));
  }
  *statistic = dVar13;
  if (klag != (int *)0x0) {
    *klag = (int)local_58;
  }
  lVar7 = 0;
  do {
    dVar13 = interpolate_linear(prob + 7,pdVar9,6,local_40);
    pdVar2[lVar7] = dVar13;
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 6;
  } while (lVar7 != 8);
  local_40 = interpolate_linear(pdVar2,dftable + 0x2f,8,*statistic);
  iVar5 = strcmp(alternative,"stationary");
  dVar13 = local_40;
  if (iVar5 != 0) {
    iVar5 = strcmp(alternative,"explosive");
    if (iVar5 != 0) {
      __s = "alternative accepts only two values - stationary and explosive ";
LAB_00149e48:
      puts(__s);
      exit(-1);
    }
    dVar13 = 1.0 - local_40;
  }
  pdVar9 = local_70;
  *pval = dVar13;
  free_reg(local_68);
  free(y_00);
  free(__src_00);
  free(x);
  free(varcovar);
  free(pdVar9);
  free(pdVar2);
  return;
}

Assistant:

void ur_pp(double *y, int N,const char* alternative,const char* type,int lshort, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    alternative - "stationary" or "explosive"
    type - "Z(alpha)" or "Z(t_alpha)"
    lshort - determines the length of lag used. lshort = 1 => lag = 4.0 * pow(((double) N)/100.0,0.25)
    else lag = 12.0 * pow(((double) N)/100.0,0.25). It can be bypassed by parameter klag
    klag - Length of the lag. Set it to > 0 instead of NULL if you wnat it to bypass lshort. Set it to NULL or negative otherwise

    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int i,j,N1,N2,p,l,pN,tN,iter;
    double *z,*yt,*yt1,*tt,*XX,*varcovar,*res,*table,*tablep;
    double at,nssqr_res,trm1,trm2,trm3,trm4,dx,alpha,s2,tstat;
    double sum_yt1,sum_yt12,sum_yt1n,interp;
    long int N3;
    reg_object fit;

    double nT[6] = {25, 50, 100, 250, 500, 100000};
    double prob[8] ={0.01, 0.025, 0.05, 0.10, 0.90, 0.95, 0.975, 0.99};
    double dftable_at[48] = {-4.38, -4.15, -4.04, -3.99, -3.98, -3.96,-3.95, -3.80, -3.73, -3.69, -3.68, -3.66,-3.60, -3.50, -3.45,
     -3.43, -3.42, -3.41,-3.24, -3.18, -3.15, -3.13, -3.13, -3.12,-1.14, -1.19, -1.22, -1.23, -1.24, -1.25,-0.80, -0.87, -0.90, -0.92,
      -0.93, -0.94,-0.50, -0.58, -0.62, -0.64, -0.65, -0.66,-0.15, -0.24, -0.28, -0.31, -0.32, -0.33};// 8X6

    double dftable[48] = {-22.5, -25.7, -27.4, -28.4, -28.9, -29.5, -19.9, -22.4, -23.6, -24.4, -24.8, -25.1, -17.9, -19.8, -20.7,
     -21.3, -21.5, -21.8, -15.6, -16.8, -17.5, -18.0, -18.1, -18.3, -3.66, -3.71, -3.74, -3.75, -3.76, -3.77, -2.51, -2.60, -2.62, 
     -2.64, -2.65, -2.66, -1.53, -1.66, -1.73, -1.78, -1.78, -1.79, -0.43, -0.65, -0.75, -0.82, -0.84, -0.87};// 8X6

    N1 = N - 1;
    N2 = N1 * N1;
    N3 = N2 * N1;

    pN = 8;
    tN = 6;

    z = (double*)malloc(sizeof(double)*2*N1);
    tt = (double*)malloc(sizeof(double)*N1);
    XX = (double*)malloc(sizeof(double)*2*N1);
    res = (double*)malloc(sizeof(double)*N1);
    tablep = (double*)malloc(sizeof(double)*pN);

    for(i = 0; i < 2;++i) {
        for(j = 0;j < N1;++j) {
            z[i*N1+j] = y[1+j-i];
        }
    } 

    yt = &z[0];
    yt1 = &z[N1];

    for(i = 1; i <= N1;++i) {
        tt[i-1] = (double)i - ((double)N1)/2.0;
    }

    p = 3;
    varcovar = (double*)malloc(sizeof(double)*p*p);

    memcpy(XX,tt,sizeof(double)*N1);
    memcpy(XX+N1,yt1,sizeof(double)*N1);

    at = 0.95;

    fit = reg_init(N1,p);

    //mdisplay(XX,2,N1);
    //mdisplay(yt,1,N1);

    regress(fit,XX,yt,res,varcovar,at);

    //summary(fit);
    //anova(fit);

    nssqr_res = 0.0;

    for(i =  0; i < N1;++i) {
        nssqr_res += (res[i]*res[i]);
    }

    nssqr_res /= ((double) N1);

    s2 = nssqr_res;

    if (lshort == 1) {
        l = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        l = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        l = *klag;
    }

    ppsum(res,N1,l,&nssqr_res);

    sum_yt1 = sum_yt12 = sum_yt1n = 0.0;

    for(i = 0; i < N1;++i) {
        sum_yt1 += yt1[i];
        sum_yt12 += (yt1[i] * yt1[i]);
        sum_yt1n += (yt1[i] * (double) (i+1));
    }

    trm1 = N2 * (N2-1) *sum_yt12 / 12.0;
    trm2 = N1 * sum_yt1n * sum_yt1n;
    trm3 = N1 * (N1+1) * sum_yt1n * sum_yt1;
    trm4 = (N1 * (N1+1) * (2*N1+1) * sum_yt1 * sum_yt1) / 6.0;

    dx = trm1-trm2+trm3-trm4;

    //printf("dx %g \n",dx);    

    if (!strcmp(type,"Z(alpha)")) {
        table = &dftable[0];
        alpha = (fit->beta+2)->value;
        *statistic = (double) N1 * (alpha - 1.0) - ((double)N3 / (24.0 * dx)) * ((double)N3 * (nssqr_res - s2));
    } else if (!strcmp(type,"Z(t_alpha)")) {
        table = &dftable_at[0];
        tstat = ((fit->beta+2)->value - 1.0) / (fit->beta+2)->stdErr;
        *statistic = sqrt(s2)/sqrt(nssqr_res)*tstat - ((double) N3) / (4*sqrt(3.0)*sqrt(dx)*sqrt(nssqr_res))*(nssqr_res - s2);
    } else {
        printf(" Type only admits two values : Z(alpha) and Z(t_alpha) \n");
        exit(-1);
    }

    //printf("stat %g (fit->beta+2)->value %g \n",*statistic,(fit->beta+2)->value);

    //printf("\n ss1 %g ss2 %g \n",s2,nssqr_res);

    if (klag != NULL) *klag = l;

    
    for(i = 0; i < pN;++i) {
        iter = i * tN;
        tablep[i] = interpolate_linear(nT,table+iter,tN,(double)N1);
    }
    
    interp = interpolate_linear(tablep,prob,pN,*statistic);

    //printf("interp %g \n",interp);

    if (!strcmp(alternative,"stationary")) {
        *pval = interp;
    } else if (!strcmp(alternative,"explosive")) {
        *pval = 1.0 - interp;
    } else {
        printf("alternative accepts only two values - stationary and explosive \n");
        exit(-1);
    }

    

    free_reg(fit);
    free(z);
    free(tt);
    free(XX);
    free(varcovar);
    free(res);
    free(tablep);
}